

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_traits.h
# Opt level: O3

Shape * dukglue::detail::apply_fp<Shape*,std::__cxx11::string_const&,std::__cxx11::string>
                  (_func_Shape_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                   *pf,tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *tup)

{
  pointer pcVar1;
  Shape *pSVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar1 = (tup->
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           ._M_head_impl._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,
             pcVar1 + (tup->
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl._M_string_length);
  pSVar2 = (*pf)(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return pSVar2;
}

Assistant:

Ret apply_fp(Ret(*pf)(Args...), const std::tuple<BakedArgs...>&  tup)
        {
            return apply_fp_helper(pf, typename make_indexes<BakedArgs...>::type(), std::tuple<BakedArgs...>(tup));
        }